

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O3

CURLcode Curl_rand(Curl_easy *data,uchar *rnd,size_t num)

{
  CURLcode CVar1;
  int __fd;
  undefined8 in_RAX;
  ssize_t sVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  curltime cVar6;
  uint r;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (num == 0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  do {
    uVar5 = 4;
    if (num < 4) {
      uVar5 = num;
    }
    CVar1 = Curl_ssl_random(data,(uchar *)((long)&uStack_38 + 4),4);
    if (CVar1 != CURLE_OK) {
      if (CVar1 != CURLE_NOT_BUILT_IN) {
        return CVar1;
      }
      if (randit_seeded == '\0') {
        __fd = open64("/dev/urandom",0);
        if (-1 < __fd) {
          sVar2 = read(__fd,&randit_randseed,4);
          if (sVar2 == 4) {
            randit_seeded = '\x01';
          }
          close(__fd);
        }
        if (randit_seeded == '\0') {
          cVar6 = Curl_now();
          Curl_infof(data,"WARNING: using weak random seed");
          randit_randseed =
               ((int)cVar6.tv_sec + cVar6.tv_usec + randit_randseed) * -0x7f82434b + 0xa70427df;
          randit_seeded = '\x01';
        }
      }
      randit_randseed = randit_randseed * 0x41c64e6d + 0x3039;
      uStack_38 = CONCAT44(randit_randseed * 0x10000 | randit_randseed >> 0x10,(undefined4)uStack_38
                          );
    }
    uVar3 = uVar5;
    uVar4 = uStack_38._4_4_;
    do {
      *rnd = (uchar)uVar4;
      rnd = rnd + 1;
      uVar4 = uStack_38._4_4_ >> 8;
      uStack_38 = CONCAT44(uVar4,(undefined4)uStack_38);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    num = num - uVar5;
  } while (num != 0);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_rand(struct Curl_easy *data, unsigned char *rnd, size_t num)
{
  CURLcode result = CURLE_BAD_FUNCTION_ARGUMENT;

  DEBUGASSERT(num > 0);

  while(num) {
    unsigned int r;
    size_t left = num < sizeof(unsigned int) ? num : sizeof(unsigned int);

    result = randit(data, &r);
    if(result)
      return result;

    while(left) {
      *rnd++ = (unsigned char)(r & 0xFF);
      r >>= 8;
      --num;
      --left;
    }
  }

  return result;
}